

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_decompressBlock_internal
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,int frame)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  BYTE *prefixStart;
  undefined8 uVar7;
  seq_t sequence;
  seq_t sequence_00;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  ulong uVar14;
  BYTE *pBVar15;
  uint uVar16;
  BYTE *pBVar17;
  ulong *puVar18;
  ulong uVar19;
  BYTE *pBVar20;
  uint uVar21;
  ulong uVar22;
  size_t sVar23;
  BYTE *pBVar24;
  int iVar25;
  BYTE *pBVar26;
  uint uVar27;
  BYTE *pBVar28;
  BYTE *oend;
  BYTE *pBVar29;
  BYTE *litLimit;
  ulong uVar30;
  void *src_00;
  ulong uVar31;
  bool bVar32;
  int nbSeq;
  BYTE *litPtr;
  seq_t sequences [4];
  ZSTD_longOffset_e in_stack_fffffffffffffdc8;
  BYTE *local_1e0;
  int local_1bc;
  BYTE *local_1b8;
  ulong local_1b0;
  BIT_DStream_t local_1a8;
  ZSTD_fseState local_180;
  ZSTD_fseState local_170;
  ZSTD_fseState local_160;
  ulong local_150 [3];
  BYTE *local_138 [2];
  long local_128;
  BYTE *local_118;
  BYTE *local_110;
  BYTE *local_108;
  BYTE *local_100;
  ulong *local_f8;
  BYTE *local_f0;
  BYTE *local_e8;
  int local_dc;
  ulong local_d8;
  size_t sStack_d0;
  ulong uStack_c8;
  BYTE *pBStack_c0;
  ulong local_b8;
  size_t local_b0;
  ulong local_a8 [15];
  
  if (0x1ffff < srcSize) {
    return 0xffffffffffffffb8;
  }
  sVar8 = ZSTD_decodeLiteralsBlock(dctx,src,srcSize);
  if (0xffffffffffffff88 < sVar8) {
    return sVar8;
  }
  src_00 = (void *)((long)src + sVar8);
  sVar8 = srcSize - sVar8;
  iVar25 = dctx->ddictIsCold;
  sVar9 = ZSTD_decodeSeqHeaders(dctx,&local_1bc,src_00,sVar8);
  if (0xffffffffffffff88 < sVar9) {
    return sVar9;
  }
  puVar18 = (ulong *)((long)src_00 + sVar9);
  uVar22 = sVar8 - sVar9;
  if (iVar25 == 0) {
    if (((frame != 0) && ((dctx->fParams).windowSize < 0x1000001)) || (local_1bc < 5)) {
      dctx->ddictIsCold = 0;
LAB_0016724e:
      sVar8 = ZSTD_decompressSequences
                        (dctx,dst,dstCapacity,puVar18,uVar22,local_1bc,in_stack_fffffffffffffdc8);
      return sVar8;
    }
    uVar21 = ZSTD_getLongOffsetsShare(dctx->OFTptr);
    dctx->ddictIsCold = 0;
    if (uVar21 < 7) goto LAB_0016724e;
  }
  else {
    dctx->ddictIsCold = 0;
  }
  if (dctx->bmi2 != 0) {
    sVar8 = ZSTD_decompressSequencesLong_bmi2
                      (dctx,dst,dstCapacity,puVar18,uVar22,local_1bc,in_stack_fffffffffffffdc8);
    return sVar8;
  }
  oend = (BYTE *)(dstCapacity + (long)dst);
  local_118 = dctx->litPtr;
  litLimit = local_118 + dctx->litSize;
  pBVar26 = (BYTE *)dst;
  if (local_1bc != 0) {
    prefixStart = (BYTE *)dctx->prefixStart;
    local_f0 = (BYTE *)dctx->virtualStart;
    local_138[1] = (BYTE *)dctx->dictEnd;
    dctx->fseEntropy = 1;
    lVar10 = -0xc;
    do {
      *(ulong *)((long)local_138 + lVar10 * 2) = (ulong)*(uint *)((long)dctx->workspace + lVar10);
      lVar10 = lVar10 + 4;
    } while (lVar10 != 0);
    iVar25 = 4;
    if (local_1bc < 4) {
      iVar25 = local_1bc;
    }
    local_128 = (long)dst - (long)prefixStart;
    local_138[0] = prefixStart;
    local_110 = local_138[1];
    if ((long)uVar22 < 0) {
      __assert_fail("iend >= ip",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x6501,
                    "size_t ZSTD_decompressSequencesLong_body(ZSTD_DCtx *, void *, size_t, const void *, size_t, int, const ZSTD_longOffset_e)"
                   );
    }
    if (sVar8 == sVar9) {
      local_1a8.bitContainer = 0;
      local_1a8.bitsConsumed = 0;
      local_1a8._12_4_ = 0;
      local_1a8.ptr = (char *)0x0;
      local_1a8.start = (char *)0x0;
      local_1a8.limitPtr = (char *)0x0;
    }
    else {
      local_1a8.limitPtr = (char *)(puVar18 + 1);
      local_1a8.start = (char *)puVar18;
      if (uVar22 < 8) {
        local_1a8.bitContainer = (size_t)(byte)*puVar18;
        switch(uVar22) {
        case 7:
          local_1a8.bitContainer =
               (ulong)*(byte *)((long)puVar18 + 6) << 0x30 | local_1a8.bitContainer;
        case 6:
          local_1a8.bitContainer =
               local_1a8.bitContainer + ((ulong)*(byte *)((long)puVar18 + 5) << 0x28);
        case 5:
          local_1a8.bitContainer =
               local_1a8.bitContainer + ((ulong)*(byte *)((long)puVar18 + 4) << 0x20);
        case 4:
          local_1a8.bitContainer =
               local_1a8.bitContainer + (ulong)*(byte *)((long)puVar18 + 3) * 0x1000000;
        case 3:
          local_1a8.bitContainer =
               local_1a8.bitContainer + (ulong)*(byte *)((long)puVar18 + 2) * 0x10000;
        case 2:
          local_1a8.bitContainer =
               local_1a8.bitContainer + (ulong)*(byte *)((long)puVar18 + 1) * 0x100;
        }
        bVar1 = *(byte *)((long)src_00 + (sVar8 - 1));
        uVar21 = 0x1f;
        if (bVar1 != 0) {
          for (; bVar1 >> uVar21 == 0; uVar21 = uVar21 - 1) {
          }
        }
        local_1a8.bitsConsumed = ~uVar21 + 9;
        if (bVar1 == 0) {
          local_1a8.bitsConsumed = 0;
        }
        local_1a8.ptr = (char *)puVar18;
        if (bVar1 != 0) {
          local_1a8.bitsConsumed = local_1a8.bitsConsumed + (int)uVar22 * -8 + 0x40;
          goto LAB_001673a0;
        }
      }
      else {
        local_1a8.ptr = (char *)((long)src_00 + (sVar8 - 8));
        local_1a8.bitContainer = *(size_t *)local_1a8.ptr;
        bVar1 = *(byte *)((long)src_00 + (sVar8 - 1));
        uVar21 = 0x1f;
        if (bVar1 != 0) {
          for (; bVar1 >> uVar21 == 0; uVar21 = uVar21 - 1) {
          }
        }
        local_1a8.bitsConsumed = ~uVar21 + 9;
        if (bVar1 == 0) {
          local_1a8.bitsConsumed = 0;
        }
        if (bVar1 != 0) {
LAB_001673a0:
          ZSTD_initFseState(&local_180,&local_1a8,dctx->LLTptr);
          ZSTD_initFseState(&local_170,&local_1a8,dctx->OFTptr);
          ZSTD_initFseState(&local_160,&local_1a8,dctx->MLTptr);
          local_dc = iVar25;
          local_108 = (BYTE *)(long)iVar25;
          puVar18 = local_a8 + 1;
          uVar22 = 0;
          do {
            uVar19 = local_150[1];
            uVar21 = local_1a8.bitsConsumed;
            if (local_1a8.bitsConsumed < 0x41) {
              if (local_1a8.ptr < local_1a8.limitPtr) {
                if (local_1a8.ptr == local_1a8.start) goto LAB_001674b3;
                uVar27 = (int)local_1a8.ptr - (int)local_1a8.start;
                if (local_1a8.start <=
                    (ulong *)((long)local_1a8.ptr - (ulong)(local_1a8.bitsConsumed >> 3))) {
                  uVar27 = local_1a8.bitsConsumed >> 3;
                }
                uVar16 = local_1a8.bitsConsumed + uVar27 * -8;
              }
              else {
                uVar27 = local_1a8.bitsConsumed >> 3;
                uVar16 = local_1a8.bitsConsumed & 7;
              }
              local_1a8.ptr = (char *)((long)local_1a8.ptr - (ulong)uVar27);
              local_1a8.bitsConsumed = uVar16;
              local_1a8.bitContainer = *(size_t *)local_1a8.ptr;
            }
LAB_001674b3:
            if ((0x40 < uVar21) || ((long)local_108 <= (long)uVar22)) {
              if ((long)uVar22 < (long)local_108) {
                bVar32 = false;
                pBVar28 = (BYTE *)0xffffffffffffffec;
                goto LAB_0016783f;
              }
              local_108 = oend + -0x20;
              goto LAB_001678ae;
            }
            local_f8 = puVar18;
            uVar5 = local_180.table[local_180.state].nextState;
            bVar1 = local_180.table[local_180.state].nbAdditionalBits;
            bVar2 = local_180.table[local_180.state].nbBits;
            uVar31 = (ulong)local_180.table[local_180.state].baseValue;
            uVar6 = local_160.table[local_160.state].nextState;
            bVar12 = local_160.table[local_160.state].nbAdditionalBits;
            bVar3 = local_160.table[local_160.state].nbBits;
            uVar30 = (ulong)local_160.table[local_160.state].baseValue;
            bVar4 = local_170.table[local_170.state].nbAdditionalBits;
            local_1b0 = CONCAT44(local_1b0._4_4_,(uint)local_170.table[local_170.state].nbBits);
            local_100 = (BYTE *)(ulong)local_170.table[local_170.state].nextState;
            bVar11 = (byte)local_1a8.bitsConsumed;
            if (bVar4 < 2) {
              if (bVar4 == 0) {
                if (uVar31 == 0) {
                  local_150[1] = local_150[0];
                  goto LAB_0016759d;
                }
              }
              else {
                local_1a8.bitsConsumed = local_1a8.bitsConsumed + 1;
                lVar10 = (ulong)(local_170.table[local_170.state].baseValue + (uint)(uVar31 == 0)) -
                         ((long)(local_1a8.bitContainer << (bVar11 & 0x3f)) >> 0x3f);
                if (lVar10 == 3) {
                  uVar19 = local_150[0] - 1;
                }
                else {
                  uVar19 = local_150[lVar10];
                }
                if (lVar10 != 1) {
                  local_150[2] = local_150[1];
                }
                local_150[1] = local_150[0];
                local_150[0] = uVar19 + (uVar19 == 0);
              }
            }
            else {
              if (0x1f < bVar4) goto LAB_001685a5;
              local_1a8.bitsConsumed = local_1a8.bitsConsumed + bVar4;
              local_150[1] = local_150[0];
              local_150[2] = uVar19;
              uVar19 = ((local_1a8.bitContainer << (bVar11 & 0x3f)) >> (-bVar4 & 0x3f)) +
                       (ulong)local_170.table[local_170.state].baseValue;
LAB_0016759d:
              local_150[1] = local_150[0];
              local_150[0] = uVar19;
            }
            uVar19 = local_150[0];
            if (bVar12 != 0) {
              bVar11 = (byte)local_1a8.bitsConsumed;
              local_1a8.bitsConsumed = local_1a8.bitsConsumed + bVar12;
              uVar30 = uVar30 + ((local_1a8.bitContainer << (bVar11 & 0x3f)) >> (-bVar12 & 0x3f));
            }
            if (0x1e < (byte)(bVar12 + bVar1 + bVar4)) {
              BIT_reloadDStream(&local_1a8);
            }
            if (bVar1 != 0) {
              bVar12 = (byte)local_1a8.bitsConsumed;
              local_1a8.bitsConsumed = local_1a8.bitsConsumed + bVar1;
              uVar31 = uVar31 + ((local_1a8.bitContainer << (bVar12 & 0x3f)) >> (-bVar1 & 0x3f));
            }
            uVar14 = local_128 + uVar31;
            pBVar28 = local_138[uVar14 < uVar19];
            local_128 = uVar14 + uVar30;
            if (0x1f < bVar2) goto LAB_00168586;
            uVar21 = bVar2 + local_1a8.bitsConsumed;
            local_180.state =
                 (ulong)((uint)(local_1a8.bitContainer >> (-(char)uVar21 & 0x3fU)) &
                        BIT_mask[(uint)bVar2]) + (ulong)uVar5;
            local_1a8.bitsConsumed = uVar21;
            if (0x1f < bVar3) goto LAB_00168586;
            local_1a8.bitsConsumed = uVar21 + bVar3;
            local_160.state =
                 (ulong)((uint)(local_1a8.bitContainer >> (-(char)local_1a8.bitsConsumed & 0x3fU)) &
                        BIT_mask[(uint)bVar3]) + (ulong)uVar6;
            if (0x1f < (byte)local_1b0) goto LAB_00168586;
            local_170.state =
                 (size_t)(local_100 +
                         ((uint)(local_1a8.bitContainer >>
                                (-(char)(local_1a8.bitsConsumed + (int)local_1b0) & 0x3fU)) &
                         BIT_mask[local_1b0 & 0xffffffff]));
            local_1a8.bitsConsumed = local_1a8.bitsConsumed + (int)local_1b0;
            local_f8[-3] = uVar31;
            local_f8[-2] = uVar30;
            local_f8[-1] = uVar19;
            *local_f8 = (ulong)(pBVar28 + (uVar14 - uVar19));
            uVar22 = uVar22 + 1;
            puVar18 = local_f8 + 4;
          } while( true );
        }
      }
    }
    bVar32 = false;
    pBVar28 = (BYTE *)0xffffffffffffffec;
    goto LAB_0016783f;
  }
  goto LAB_00167847;
joined_r0x00168158:
  pBStack_c0 = pBVar17;
  if (local_1bc <= (int)uVar27) goto LAB_00168559;
  uVar22 = (ulong)((uVar27 & 3) << 5);
  local_d8 = *(ulong *)((long)&local_b8 + uVar22);
  sVar23 = *(size_t *)((long)&local_b0 + uVar22);
  pBVar28 = (BYTE *)(local_d8 + sVar23);
  if ((long)pBVar28 <= (long)local_d8) {
LAB_001685c4:
    local_d8 = uVar30;
    __assert_fail("oLitEnd < oMatchEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x6386,
                  "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                 );
  }
  uVar19 = *(ulong *)((long)local_a8 + uVar22);
  pBStack_c0 = *(BYTE **)((long)local_a8 + uVar22 + 8);
  pBVar20 = (BYTE *)((long)local_118 + local_d8);
  if ((litLimit < pBVar20) || (pBVar24 = pBVar28 + (long)pBVar26, local_108 < pBVar24)) {
    sequence_00.matchLength = sVar23;
    sequence_00.litLength = local_d8;
    sequence_00.offset = uVar19;
    sequence_00.match = pBStack_c0;
    sStack_d0 = sVar23;
    uStack_c8 = uVar19;
    pBVar28 = (BYTE *)ZSTD_execSequenceEnd
                                (pBVar26,oend,sequence_00,&local_118,litLimit,prefixStart,local_f0,
                                 local_110);
  }
  else {
    pBVar29 = (BYTE *)((long)pBVar26 + local_d8);
    pBStack_c0 = pBVar17;
    if (local_108 < pBVar29) {
LAB_001685e3:
      local_d8 = uVar30;
      __assert_fail("oLitEnd <= oend_w",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x638c,
                    "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    uVar7 = *(undefined8 *)((long)local_118 + 8);
    *(undefined8 *)pBVar26 = *(undefined8 *)local_118;
    *(undefined8 *)((long)pBVar26 + 8) = uVar7;
    bVar32 = 0x10 < local_d8;
    local_d8 = uVar30;
    if (bVar32) {
      ZSTD_decompressBlock_internal();
    }
    pBVar17 = pBVar29 + -uVar19;
    local_118 = pBVar20;
    if ((ulong)((long)pBVar29 - (long)prefixStart) < uVar19) {
      local_1b8 = pBVar26;
      if ((ulong)((long)pBVar29 - (long)local_f0) < uVar19) {
        pBVar28 = (BYTE *)0xffffffffffffffec;
      }
      else {
        lVar10 = (long)pBVar17 - (long)prefixStart;
        pBVar26 = local_110 + lVar10;
        if (local_110 < pBVar26 + sVar23) {
          memmove(pBVar29,pBVar26,-lVar10);
          pBVar29 = pBVar29 + -lVar10;
          sVar23 = sVar23 + lVar10;
          pBVar26 = local_1b8;
          pBVar17 = prefixStart;
          goto LAB_0016827f;
        }
        memmove(pBVar29,pBVar26,sVar23);
        pBVar26 = local_1b8;
      }
    }
    else {
LAB_0016827f:
      if (pBVar24 < pBVar29) {
LAB_00168602:
        __assert_fail("op <= oMatchEnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x63ac,
                      "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                     );
      }
      if (pBVar17 < prefixStart) {
LAB_00168640:
        __assert_fail("match >= prefixStart",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x63ae,
                      "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                     );
      }
      if (sVar23 == 0) {
LAB_00168621:
        __assert_fail("sequence.matchLength >= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x63af,
                      "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                     );
      }
      if (uVar19 < 0x10) {
        if (pBVar29 < pBVar17) {
LAB_001686bc:
          __assert_fail("*ip <= *op",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x6301,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
        }
        if (uVar19 < 8) {
          iVar25 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)::
                            dec64table + uVar19 * 4);
          *pBVar29 = *pBVar17;
          pBVar29[1] = pBVar17[1];
          pBVar29[2] = pBVar17[2];
          pBVar29[3] = pBVar17[3];
          pBVar20 = pBVar17 + *(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                        ::dec32table + uVar19 * 4);
          pBVar17 = pBVar17 + ((ulong)*(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                ::dec32table + uVar19 * 4) - (long)iVar25);
          *(undefined4 *)(pBVar29 + 4) = *(undefined4 *)pBVar20;
        }
        else {
          *(undefined8 *)pBVar29 = *(undefined8 *)pBVar17;
        }
        pBVar20 = pBVar17 + 8;
        pBVar15 = pBVar29 + 8;
        lVar10 = (long)pBVar15 - (long)pBVar20;
        if (lVar10 < 8) {
LAB_001686db:
          __assert_fail("*op - *ip >= 8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x6313,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
        }
        if (8 < sVar23) {
          if (pBVar24 <= pBVar15) {
LAB_001686fa:
            __assert_fail("op < oMatchEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x63c3,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (lVar10 < 0x10) {
            do {
              *(undefined8 *)pBVar15 = *(undefined8 *)pBVar20;
              pBVar15 = pBVar15 + 8;
              pBVar20 = pBVar20 + 8;
            } while (pBVar15 < pBVar29 + sVar23);
          }
          else {
            if (0xffffffffffffffe0 < lVar10 - 0x10U) {
LAB_0016865f:
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar7 = *(undefined8 *)(pBVar17 + 0x10);
            *(undefined8 *)pBVar15 = *(undefined8 *)pBVar20;
            *(undefined8 *)(pBVar29 + 0x10) = uVar7;
            if (0x18 < (long)sVar23) {
              lVar10 = 0;
              do {
                uVar7 = *(undefined8 *)(pBVar17 + lVar10 + 0x18 + 8);
                pBVar20 = pBVar29 + lVar10 + 0x18;
                *(undefined8 *)pBVar20 = *(undefined8 *)(pBVar17 + lVar10 + 0x18);
                *(undefined8 *)(pBVar20 + 8) = uVar7;
                uVar7 = *(undefined8 *)(pBVar17 + lVar10 + 0x28 + 8);
                *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)(pBVar17 + lVar10 + 0x28);
                *(undefined8 *)(pBVar20 + 0x18) = uVar7;
                lVar10 = lVar10 + 0x20;
              } while (pBVar20 + 0x20 < pBVar29 + sVar23);
            }
          }
        }
      }
      else {
        if ((BYTE *)0xffffffffffffffe8 < pBVar29 + (-8 - (long)pBVar17)) {
LAB_0016867e:
          __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x1268,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        if ((BYTE *)0xffffffffffffffe0 < pBVar29 + (-0x10 - (long)pBVar17)) goto LAB_0016865f;
        uVar7 = *(undefined8 *)(pBVar17 + 8);
        *(undefined8 *)pBVar29 = *(undefined8 *)pBVar17;
        *(undefined8 *)(pBVar29 + 8) = uVar7;
        if (0x10 < (long)sVar23) {
          lVar10 = 0x10;
          do {
            uVar7 = *(undefined8 *)(pBVar17 + lVar10 + 8);
            pBVar20 = pBVar29 + lVar10;
            *(undefined8 *)pBVar20 = *(undefined8 *)(pBVar17 + lVar10);
            *(undefined8 *)(pBVar20 + 8) = uVar7;
            uVar7 = *(undefined8 *)(pBVar17 + lVar10 + 0x10 + 8);
            *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)(pBVar17 + lVar10 + 0x10);
            *(undefined8 *)(pBVar20 + 0x18) = uVar7;
            lVar10 = lVar10 + 0x20;
          } while (pBVar20 + 0x20 < pBVar29 + sVar23);
        }
      }
    }
  }
  bVar32 = false;
  pBVar17 = (BYTE *)0x0;
  if (pBVar28 < (BYTE *)0xffffffffffffff89) {
    pBVar17 = pBVar28;
  }
  pBVar26 = pBVar26 + (long)pBVar17;
  if ((BYTE *)0xffffffffffffff88 < pBVar28) goto LAB_0016783f;
  uVar27 = uVar27 + 1;
  uVar30 = local_d8;
  pBVar17 = pBStack_c0;
  goto joined_r0x00168158;
LAB_00168559:
  lVar10 = 0;
  do {
    (dctx->entropy).rep[lVar10] = (U32)local_150[lVar10];
    lVar10 = lVar10 + 1;
    bVar32 = true;
    pBVar28 = local_1e0;
    local_d8 = uVar30;
  } while (lVar10 != 3);
  goto LAB_0016783f;
LAB_001678ae:
  uVar19 = local_150[1];
  uVar21 = local_1a8.bitsConsumed;
  if (local_1a8.bitsConsumed < 0x41) {
    if (local_1a8.ptr < local_1a8.limitPtr) {
      if (local_1a8.ptr == local_1a8.start) goto LAB_00167935;
      uVar27 = (int)local_1a8.ptr - (int)local_1a8.start;
      if (local_1a8.start <= (ulong *)((long)local_1a8.ptr - (ulong)(local_1a8.bitsConsumed >> 3)))
      {
        uVar27 = local_1a8.bitsConsumed >> 3;
      }
      uVar16 = local_1a8.bitsConsumed + uVar27 * -8;
    }
    else {
      uVar27 = local_1a8.bitsConsumed >> 3;
      uVar16 = local_1a8.bitsConsumed & 7;
    }
    local_1a8.ptr = (char *)((long)local_1a8.ptr - (ulong)uVar27);
    local_1a8.bitsConsumed = uVar16;
    local_1a8.bitContainer = *(size_t *)local_1a8.ptr;
  }
LAB_00167935:
  uVar27 = (uint)uVar22;
  if ((uVar21 < 0x41) && ((int)uVar27 < local_1bc)) {
    uVar5 = local_180.table[local_180.state].nextState;
    bVar1 = local_180.table[local_180.state].nbAdditionalBits;
    bVar2 = local_180.table[local_180.state].nbBits;
    uVar22 = (ulong)local_180.table[local_180.state].baseValue;
    bVar12 = local_160.table[local_160.state].nbAdditionalBits;
    bVar3 = local_160.table[local_160.state].nbBits;
    local_f8 = (ulong *)(ulong)local_160.table[local_160.state].baseValue;
    uVar6 = local_170.table[local_170.state].nextState;
    bVar4 = local_170.table[local_170.state].nbAdditionalBits;
    bVar11 = local_170.table[local_170.state].nbBits;
    bVar13 = (byte)local_1a8.bitsConsumed;
    if (bVar4 < 2) {
      if (bVar4 == 0) {
        if (uVar22 == 0) {
          local_150[1] = local_150[0];
          local_150[0] = uVar19;
        }
      }
      else {
        local_1a8.bitsConsumed = local_1a8.bitsConsumed + 1;
        lVar10 = (ulong)(local_170.table[local_170.state].baseValue + (uint)(uVar22 == 0)) -
                 ((long)(local_1a8.bitContainer << (bVar13 & 0x3f)) >> 0x3f);
        if (lVar10 == 3) {
          uVar19 = local_150[0] - 1;
        }
        else {
          uVar19 = local_150[lVar10];
        }
        if (lVar10 != 1) {
          local_150[2] = local_150[1];
        }
        local_150[1] = local_150[0];
        local_150[0] = uVar19 + (uVar19 == 0);
      }
    }
    else {
      if (0x1f < bVar4) {
LAB_001685a5:
        __assert_fail("ofBits <= MaxOff",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x6407,
                      "seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e, const ZSTD_prefetch_e)"
                     );
      }
      local_1a8.bitsConsumed = local_1a8.bitsConsumed + bVar4;
      local_150[1] = local_150[0];
      local_150[2] = uVar19;
      local_150[0] = ((local_1a8.bitContainer << (bVar13 & 0x3f)) >> (-bVar4 & 0x3f)) +
                     (ulong)local_170.table[local_170.state].baseValue;
    }
    if (bVar12 != 0) {
      bVar13 = (byte)local_1a8.bitsConsumed;
      local_1a8.bitsConsumed = local_1a8.bitsConsumed + bVar12;
      local_f8 = (ulong *)((long)(ulong)local_160.table[local_160.state].baseValue +
                          ((local_1a8.bitContainer << (bVar13 & 0x3f)) >> (-bVar12 & 0x3f)));
    }
    pBVar28 = (BYTE *)(ulong)local_160.table[local_160.state].nextState;
    local_1b0 = local_150[0];
    if (0x1e < (byte)(bVar12 + bVar1 + bVar4)) {
      local_1b8 = pBVar26;
      local_100 = (BYTE *)(ulong)local_160.table[local_160.state].nextState;
      BIT_reloadDStream(&local_1a8);
      pBVar28 = local_100;
      pBVar26 = local_1b8;
    }
    if (bVar1 != 0) {
      bVar12 = (byte)local_1a8.bitsConsumed;
      local_1a8.bitsConsumed = local_1a8.bitsConsumed + bVar1;
      uVar22 = uVar22 + ((local_1a8.bitContainer << (bVar12 & 0x3f)) >> (-bVar1 & 0x3f));
    }
    uVar19 = local_128 + uVar22;
    local_128 = uVar19 + (long)local_f8;
    if (0x1f < bVar2) {
LAB_00168586:
      __assert_fail("nbBits < BIT_MASK_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x65d,"size_t BIT_getMiddleBits(size_t, const U32, const U32)");
    }
    uVar21 = bVar2 + local_1a8.bitsConsumed;
    local_180.state =
         (ulong)((uint)(local_1a8.bitContainer >> (-(char)uVar21 & 0x3fU)) & BIT_mask[bVar2]) +
         (ulong)uVar5;
    local_1a8.bitsConsumed = uVar21;
    if (0x1f < bVar3) goto LAB_00168586;
    local_100 = local_138[uVar19 < local_1b0] + uVar19;
    local_1a8.bitsConsumed = uVar21 + bVar3;
    local_160.state =
         (size_t)(pBVar28 +
                 ((uint)(local_1a8.bitContainer >> (-(char)local_1a8.bitsConsumed & 0x3fU)) &
                 BIT_mask[(uint)bVar3]));
    if (0x1f < bVar11) goto LAB_00168586;
    local_1a8.bitsConsumed = local_1a8.bitsConsumed + bVar11;
    local_170.state =
         (ulong)((uint)(local_1a8.bitContainer >> (-(char)local_1a8.bitsConsumed & 0x3fU)) &
                BIT_mask[(uint)bVar11]) + (ulong)uVar6;
    uVar31 = (ulong)((uVar27 & 3) << 5);
    uVar19 = *(ulong *)((long)&local_b8 + uVar31);
    sVar23 = *(size_t *)((long)&local_b0 + uVar31);
    pBVar28 = (BYTE *)(uVar19 + sVar23);
    uVar30 = local_d8;
    if ((long)pBVar28 <= (long)uVar19) goto LAB_001685c4;
    uVar14 = *(ulong *)((long)local_a8 + uVar31);
    pBVar20 = *(BYTE **)((long)local_a8 + uVar31 + 8);
    pBVar17 = local_118 + uVar19;
    if ((litLimit < pBVar17) || (pBVar24 = pBVar26 + (long)pBVar28, local_108 < pBVar24)) {
      sequence.matchLength = sVar23;
      sequence.litLength = uVar19;
      sequence.offset = uVar14;
      sequence.match = pBVar20;
      local_d8 = uVar19;
      sStack_d0 = sVar23;
      uStack_c8 = uVar14;
      pBStack_c0 = pBVar20;
      pBVar28 = (BYTE *)ZSTD_execSequenceEnd
                                  (pBVar26,oend,sequence,&local_118,litLimit,prefixStart,local_f0,
                                   local_110);
    }
    else {
      pBVar20 = pBVar26 + uVar19;
      if (local_108 < pBVar20) goto LAB_001685e3;
      uVar7 = *(undefined8 *)(local_118 + 8);
      *(undefined8 *)pBVar26 = *(undefined8 *)local_118;
      *(undefined8 *)(pBVar26 + 8) = uVar7;
      if (0x10 < uVar19) {
        local_e8 = pBVar24;
        ZSTD_decompressBlock_internal();
        pBVar24 = local_e8;
      }
      pBVar29 = pBVar20 + -uVar14;
      local_118 = pBVar17;
      if ((ulong)((long)pBVar20 - (long)prefixStart) < uVar14) {
        if ((ulong)((long)pBVar20 - (long)local_f0) < uVar14) {
          pBVar28 = (BYTE *)0xffffffffffffffec;
        }
        else {
          lVar10 = (long)pBVar29 - (long)prefixStart;
          pBVar17 = local_110 + lVar10;
          local_1b8 = pBVar26;
          if (local_110 < pBVar17 + sVar23) {
            local_e8 = pBVar24;
            memmove(pBVar20,pBVar17,-lVar10);
            pBVar20 = pBVar20 + -lVar10;
            sVar23 = sVar23 + lVar10;
            pBVar24 = local_e8;
            pBVar26 = local_1b8;
            pBVar29 = prefixStart;
            goto LAB_00167d03;
          }
          memmove(pBVar20,pBVar17,sVar23);
          pBVar26 = local_1b8;
        }
      }
      else {
LAB_00167d03:
        if (pBVar24 < pBVar20) goto LAB_00168602;
        if (pBVar29 < prefixStart) goto LAB_00168640;
        if (sVar23 == 0) goto LAB_00168621;
        if (uVar14 < 0x10) {
          if (pBVar20 < pBVar29) goto LAB_001686bc;
          if (uVar14 < 8) {
            iVar25 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                              ::dec64table + uVar14 * 4);
            *pBVar20 = *pBVar29;
            pBVar20[1] = pBVar29[1];
            pBVar20[2] = pBVar29[2];
            pBVar20[3] = pBVar29[3];
            pBVar17 = pBVar29 + *(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                          ::dec32table + uVar14 * 4);
            pBVar29 = pBVar29 + ((ulong)*(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar14 * 4) - (long)iVar25);
            *(undefined4 *)(pBVar20 + 4) = *(undefined4 *)pBVar17;
          }
          else {
            *(undefined8 *)pBVar20 = *(undefined8 *)pBVar29;
          }
          pBVar15 = pBVar29 + 8;
          pBVar17 = pBVar20 + 8;
          lVar10 = (long)pBVar17 - (long)pBVar15;
          if (lVar10 < 8) goto LAB_001686db;
          if (8 < sVar23) {
            if (pBVar24 <= pBVar17) goto LAB_001686fa;
            if (lVar10 < 0x10) {
              do {
                *(undefined8 *)pBVar17 = *(undefined8 *)pBVar15;
                pBVar17 = pBVar17 + 8;
                pBVar15 = pBVar15 + 8;
              } while (pBVar17 < pBVar20 + sVar23);
            }
            else {
              if (0xffffffffffffffe0 < lVar10 - 0x10U) goto LAB_0016865f;
              uVar7 = *(undefined8 *)(pBVar29 + 0x10);
              *(undefined8 *)pBVar17 = *(undefined8 *)pBVar15;
              *(undefined8 *)(pBVar20 + 0x10) = uVar7;
              if (0x18 < (long)sVar23) {
                lVar10 = 0;
                do {
                  uVar7 = *(undefined8 *)(pBVar29 + lVar10 + 0x18 + 8);
                  pBVar17 = pBVar20 + lVar10 + 0x18;
                  *(undefined8 *)pBVar17 = *(undefined8 *)(pBVar29 + lVar10 + 0x18);
                  *(undefined8 *)(pBVar17 + 8) = uVar7;
                  uVar7 = *(undefined8 *)(pBVar29 + lVar10 + 0x28 + 8);
                  *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)(pBVar29 + lVar10 + 0x28);
                  *(undefined8 *)(pBVar17 + 0x18) = uVar7;
                  lVar10 = lVar10 + 0x20;
                } while (pBVar17 + 0x20 < pBVar20 + sVar23);
              }
            }
          }
        }
        else {
          if ((BYTE *)0xffffffffffffffe8 < pBVar20 + (-8 - (long)pBVar29)) goto LAB_0016867e;
          if ((BYTE *)0xffffffffffffffe0 < pBVar20 + (-0x10 - (long)pBVar29)) goto LAB_0016865f;
          uVar7 = *(undefined8 *)(pBVar29 + 8);
          *(undefined8 *)pBVar20 = *(undefined8 *)pBVar29;
          *(undefined8 *)(pBVar20 + 8) = uVar7;
          if (0x10 < (long)sVar23) {
            lVar10 = 0x10;
            do {
              uVar7 = *(undefined8 *)(pBVar29 + lVar10 + 8);
              pBVar17 = pBVar20 + lVar10;
              *(undefined8 *)pBVar17 = *(undefined8 *)(pBVar29 + lVar10);
              *(undefined8 *)(pBVar17 + 8) = uVar7;
              uVar7 = *(undefined8 *)(pBVar29 + lVar10 + 0x10 + 8);
              *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)(pBVar29 + lVar10 + 0x10);
              *(undefined8 *)(pBVar17 + 0x18) = uVar7;
              lVar10 = lVar10 + 0x20;
            } while (pBVar17 + 0x20 < pBVar20 + sVar23);
          }
        }
      }
    }
    if ((BYTE *)0xffffffffffffff88 < pBVar28) goto LAB_0016813e;
    *(ulong *)((long)&local_b8 + uVar31) = uVar22;
    *(ulong **)((long)&local_b0 + uVar31) = local_f8;
    *(ulong *)((long)local_a8 + uVar31) = local_1b0;
    *(ulong *)((long)local_a8 + uVar31 + 8) = (long)local_100 - local_1b0;
    pBVar26 = pBVar26 + (long)pBVar28;
    uVar22 = (ulong)(uVar27 + 1);
    goto LAB_001678ae;
  }
  if (local_1bc <= (int)uVar27) {
    uVar27 = uVar27 - local_dc;
    uVar30 = local_d8;
    pBVar17 = pBStack_c0;
    goto joined_r0x00168158;
  }
  pBVar28 = (BYTE *)0xffffffffffffffec;
LAB_0016813e:
  bVar32 = false;
LAB_0016783f:
  if (bVar32) {
LAB_00167847:
    uVar22 = (long)litLimit - (long)local_118;
    if ((ulong)((long)oend - (long)pBVar26) < uVar22) {
      pBVar28 = (BYTE *)0xffffffffffffffba;
    }
    else {
      memcpy(pBVar26,local_118,uVar22);
      pBVar28 = pBVar26 + (uVar22 - (long)dst);
    }
  }
  return (size_t)pBVar28;
}

Assistant:

size_t
ZSTD_decompressBlock_internal(ZSTD_DCtx* dctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize, const int frame)
{   /* blockType == blockCompressed */
    const BYTE* ip = (const BYTE*)src;
    /* isLongOffset must be true if there are long offsets.
     * Offsets are long if they are larger than 2^STREAM_ACCUMULATOR_MIN.
     * We don't expect that to be the case in 64-bit mode.
     * In block mode, window size is not known, so we have to be conservative.
     * (note: but it could be evaluated from current-lowLimit)
     */
    ZSTD_longOffset_e const isLongOffset = (ZSTD_longOffset_e)(MEM_32bits() && (!frame || (dctx->fParams.windowSize > (1ULL << STREAM_ACCUMULATOR_MIN))));
    DEBUGLOG(5, "ZSTD_decompressBlock_internal (size : %u)", (U32)srcSize);

    RETURN_ERROR_IF(srcSize >= ZSTD_BLOCKSIZE_MAX, srcSize_wrong);

    /* Decode literals section */
    {   size_t const litCSize = ZSTD_decodeLiteralsBlock(dctx, src, srcSize);
        DEBUGLOG(5, "ZSTD_decodeLiteralsBlock : %u", (U32)litCSize);
        if (ZSTD_isError(litCSize)) return litCSize;
        ip += litCSize;
        srcSize -= litCSize;
    }

    /* Build Decoding Tables */
    {
        /* These macros control at build-time which decompressor implementation
         * we use. If neither is defined, we do some inspection and dispatch at
         * runtime.
         */
#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        int usePrefetchDecoder = dctx->ddictIsCold;
#endif
        int nbSeq;
        size_t const seqHSize = ZSTD_decodeSeqHeaders(dctx, &nbSeq, ip, srcSize);
        if (ZSTD_isError(seqHSize)) return seqHSize;
        ip += seqHSize;
        srcSize -= seqHSize;

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if ( !usePrefetchDecoder
          && (!frame || (dctx->fParams.windowSize > (1<<24)))
          && (nbSeq>ADVANCED_SEQS) ) {  /* could probably use a larger nbSeq limit */
            U32 const shareLongOffsets = ZSTD_getLongOffsetsShare(dctx->OFTptr);
            U32 const minShare = MEM_64bits() ? 7 : 20; /* heuristic values, correspond to 2.73% and 7.81% */
            usePrefetchDecoder = (shareLongOffsets >= minShare);
        }
#endif

        dctx->ddictIsCold = 0;

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if (usePrefetchDecoder)
#endif
#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT
            return ZSTD_decompressSequencesLong(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
#endif

#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG
        /* else */
        return ZSTD_decompressSequences(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
#endif
    }
}